

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerExpression.cpp
# Opt level: O2

BaseExpressionPtr __thiscall
Kandinsky::PowerExpression::derivative(PowerExpression *this,VariableExpressionPtr *variable)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *arg2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *arg1;
  BaseExpressionPtr BVar1;
  shared_ptr<Kandinsky::BaseExpression> local_1c0;
  shared_ptr<Kandinsky::BaseExpression> local_1b0;
  shared_ptr<Kandinsky::BaseExpression> local_1a0;
  int local_190 [2];
  shared_ptr<Kandinsky::BaseExpression> local_188;
  Expression local_178;
  Expression local_160;
  Expression local_148;
  Expression local_130;
  Expression local_118;
  UnaryExpression local_100;
  Expression local_e8;
  Expression local_d0;
  Expression local_b8;
  Expression local_a0;
  Expression local_88;
  BinaryExpression local_70;
  BinaryExpression local_48;
  
  (*(variable[1].super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
     _M_refcount._M_pi)->_vptr__Sp_counted_base[1])(&local_188);
  local_190[1] = 0;
  operator!=<std::shared_ptr<Kandinsky::BaseExpression>,_int,_nullptr>
            (&local_a0,&local_188,local_190 + 1);
  arg2 = &variable[1].super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  arg1 = &(variable->super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount;
  pow<std::shared_ptr<Kandinsky::BaseExpression>,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            ((PowerExpression *)&local_48,(shared_ptr<Kandinsky::BaseExpression> *)arg1,
             (shared_ptr<Kandinsky::BaseExpression> *)arg2);
  (*arg2->_M_pi->_vptr__Sp_counted_base[1])(&local_1a0);
  log<std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            ((NaturalLogarithmExpression *)&local_100,(shared_ptr<Kandinsky::BaseExpression> *)arg1)
  ;
  operator*<std::shared_ptr<Kandinsky::BaseExpression>,_Kandinsky::NaturalLogarithmExpression,_nullptr>
            (&local_e8,&local_1a0,(NaturalLogarithmExpression *)&local_100);
  (*arg1->_M_pi->_vptr__Sp_counted_base[1])(&local_1b0);
  operator*<std::shared_ptr<Kandinsky::BaseExpression>,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (&local_130,(shared_ptr<Kandinsky::BaseExpression> *)arg2,&local_1b0);
  operator/<Kandinsky::Expression,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (&local_118,&local_130,(shared_ptr<Kandinsky::BaseExpression> *)arg1);
  operator+<Kandinsky::Expression,_Kandinsky::Expression,_nullptr>(&local_d0,&local_e8,&local_118);
  operator*<Kandinsky::PowerExpression,_Kandinsky::Expression,_nullptr>
            (&local_b8,(PowerExpression *)&local_48,&local_d0);
  (*arg1->_M_pi->_vptr__Sp_counted_base[1])(&local_1c0);
  operator*<std::shared_ptr<Kandinsky::BaseExpression>,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (&local_160,(shared_ptr<Kandinsky::BaseExpression> *)arg2,&local_1c0);
  local_190[0] = 1;
  operator-<std::shared_ptr<Kandinsky::BaseExpression>,_int,_nullptr>
            (&local_178,(shared_ptr<Kandinsky::BaseExpression> *)arg2,local_190);
  pow<std::shared_ptr<Kandinsky::BaseExpression>,_Kandinsky::Expression,_nullptr>
            ((PowerExpression *)&local_70,(shared_ptr<Kandinsky::BaseExpression> *)arg1,&local_178);
  operator*<Kandinsky::Expression,_Kandinsky::PowerExpression,_nullptr>
            (&local_148,&local_160,(PowerExpression *)&local_70);
  ifThenElse<Kandinsky::Expression,_Kandinsky::Expression,_Kandinsky::Expression,_nullptr>
            (&local_88,&local_a0,&local_b8,&local_148);
  BaseExpression::makePtr<Kandinsky::Expression>((BaseExpression *)this,&local_88);
  Expression::~Expression(&local_88);
  Expression::~Expression(&local_148);
  BinaryExpression::~BinaryExpression(&local_70);
  Expression::~Expression(&local_178);
  Expression::~Expression(&local_160);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1c0.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Expression::~Expression(&local_b8);
  Expression::~Expression(&local_d0);
  Expression::~Expression(&local_118);
  Expression::~Expression(&local_130);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1b0.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Expression::~Expression(&local_e8);
  UnaryExpression::~UnaryExpression(&local_100);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1a0.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  BinaryExpression::~BinaryExpression(&local_48);
  Expression::~Expression(&local_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_188.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  BVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  BVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (BaseExpressionPtr)
         BVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

BaseExpressionPtr PowerExpression::derivative(const VariableExpressionPtr& variable) const
    {
        return makePtr(ifThenElse(m_arg2->derivative(variable) != 0,
                pow(m_arg1, m_arg2) * (
                m_arg2->derivative(variable) * log(m_arg1) +
                m_arg2 * m_arg1->derivative(variable) / m_arg1),
                m_arg2 * m_arg1->derivative(variable) * pow(m_arg1, m_arg2 - 1)));
    }